

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

void Curl_setup_transfer(Curl_easy *data,int sockindex,curl_off_t size,_Bool getheader,
                        int writesockindex)

{
  connectdata *pcVar1;
  HTTP *pHVar2;
  bool bVar3;
  curltime cVar4;
  curl_socket_t local_6c;
  curl_socket_t local_68;
  curl_socket_t local_64;
  curl_socket_t local_60;
  undefined4 uStack_4c;
  _Bool httpsending;
  HTTP *http;
  connectdata *conn;
  SingleRequest *k;
  int writesockindex_local;
  _Bool getheader_local;
  curl_off_t size_local;
  int sockindex_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  pHVar2 = (data->req).p.http;
  bVar3 = false;
  if ((pcVar1->handler->protocol & 3) != 0) {
    bVar3 = pHVar2->sending == HTTPSEND_REQUEST;
  }
  k._0_4_ = writesockindex;
  if ((((*(uint *)&(pcVar1->bits).field_0x4 >> 0x18 & 1) != 0) || (pcVar1->httpversion == '\x14'))
     || (bVar3)) {
    if (sockindex == -1) {
      if (writesockindex == -1) {
        local_60 = -1;
      }
      else {
        local_60 = pcVar1->sock[writesockindex];
      }
      local_64 = local_60;
    }
    else {
      local_64 = pcVar1->sock[sockindex];
    }
    pcVar1->sockfd = local_64;
    pcVar1->writesockfd = pcVar1->sockfd;
    if (bVar3) {
      k._0_4_ = 0;
    }
  }
  else {
    if (sockindex == -1) {
      local_68 = -1;
    }
    else {
      local_68 = pcVar1->sock[sockindex];
    }
    pcVar1->sockfd = local_68;
    if (writesockindex == -1) {
      local_6c = -1;
    }
    else {
      local_6c = pcVar1->sock[writesockindex];
    }
    pcVar1->writesockfd = local_6c;
  }
  *(ushort *)&(data->req).field_0xd9 =
       *(ushort *)&(data->req).field_0xd9 & 0xfeff | (ushort)getheader << 8;
  (data->req).size = size;
  if (((*(ushort *)&(data->req).field_0xd9 >> 8 & 1) == 0) &&
     (*(ushort *)&(data->req).field_0xd9 = *(ushort *)&(data->req).field_0xd9 & 0xfffe, 0 < size)) {
    Curl_pgrsSetDownloadSize(data,size);
  }
  if (((*(ushort *)&(data->req).field_0xd9 >> 8 & 1) != 0) ||
     ((*(ulong *)&(data->set).field_0x8e2 >> 0x19 & 1) == 0)) {
    if (sockindex != -1) {
      (data->req).keepon = (data->req).keepon | 1;
    }
    if ((int)k != -1) {
      if ((((*(uint *)&(data->state).field_0x6d0 >> 7 & 1) == 0) ||
          ((pcVar1->handler->protocol & 3) == 0)) || (pHVar2->sending != HTTPSEND_BODY)) {
        if ((*(uint *)&(data->state).field_0x6d0 >> 7 & 1) != 0) {
          (data->req).exp100 = EXP100_SENDING_REQUEST;
        }
        (data->req).keepon = (data->req).keepon | 2;
      }
      else {
        (data->req).exp100 = EXP100_AWAITING_CONTINUE;
        cVar4 = Curl_now();
        (data->req).start100.tv_sec = cVar4.tv_sec;
        *(ulong *)&(data->req).start100.tv_usec = CONCAT44(uStack_4c,cVar4.tv_usec);
        Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
      }
    }
  }
  return;
}

Assistant:

void
Curl_setup_transfer(
  struct Curl_easy *data,   /* transfer */
  int sockindex,            /* socket index to read from or -1 */
  curl_off_t size,          /* -1 if unknown at this point */
  bool getheader,           /* TRUE if header parsing is wanted */
  int writesockindex        /* socket index to write to, it may very well be
                               the same we read from. -1 disables */
  )
{
  struct SingleRequest *k = &data->req;
  struct connectdata *conn = data->conn;
  struct HTTP *http = data->req.p.http;
  bool httpsending;

  DEBUGASSERT(conn != NULL);
  DEBUGASSERT((sockindex <= 1) && (sockindex >= -1));

  httpsending = ((conn->handler->protocol&PROTO_FAMILY_HTTP) &&
                 (http->sending == HTTPSEND_REQUEST));

  if(conn->bits.multiplex || conn->httpversion == 20 || httpsending) {
    /* when multiplexing, the read/write sockets need to be the same! */
    conn->sockfd = sockindex == -1 ?
      ((writesockindex == -1 ? CURL_SOCKET_BAD : conn->sock[writesockindex])) :
      conn->sock[sockindex];
    conn->writesockfd = conn->sockfd;
    if(httpsending)
      /* special and very HTTP-specific */
      writesockindex = FIRSTSOCKET;
  }
  else {
    conn->sockfd = sockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[sockindex];
    conn->writesockfd = writesockindex == -1 ?
      CURL_SOCKET_BAD:conn->sock[writesockindex];
  }
  k->getheader = getheader;

  k->size = size;

  /* The code sequence below is placed in this function just because all
     necessary input is not always known in do_complete() as this function may
     be called after that */

  if(!k->getheader) {
    k->header = FALSE;
    if(size > 0)
      Curl_pgrsSetDownloadSize(data, size);
  }
  /* we want header and/or body, if neither then don't do this! */
  if(k->getheader || !data->set.opt_no_body) {

    if(sockindex != -1)
      k->keepon |= KEEP_RECV;

    if(writesockindex != -1) {
      /* HTTP 1.1 magic:

         Even if we require a 100-return code before uploading data, we might
         need to write data before that since the REQUEST may not have been
         finished sent off just yet.

         Thus, we must check if the request has been sent before we set the
         state info where we wait for the 100-return code
      */
      if((data->state.expect100header) &&
         (conn->handler->protocol&PROTO_FAMILY_HTTP) &&
         (http->sending == HTTPSEND_BODY)) {
        /* wait with write until we either got 100-continue or a timeout */
        k->exp100 = EXP100_AWAITING_CONTINUE;
        k->start100 = Curl_now();

        /* Set a timeout for the multi interface. Add the inaccuracy margin so
           that we don't fire slightly too early and get denied to run. */
        Curl_expire(data, data->set.expect_100_timeout, EXPIRE_100_TIMEOUT);
      }
      else {
        if(data->state.expect100header)
          /* when we've sent off the rest of the headers, we must await a
             100-continue but first finish sending the request */
          k->exp100 = EXP100_SENDING_REQUEST;

        /* enable the write bit when we're not waiting for continue */
        k->keepon |= KEEP_SEND;
      }
    } /* if(writesockindex != -1) */
  } /* if(k->getheader || !data->set.opt_no_body) */

}